

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O0

void __thiscall
IRBuilderAsmJs::BuildInt1Const1
          (IRBuilderAsmJs *this,OpCodeAsmJs newOpcode,uint32 offset,RegSlot dstRegSlot,int constInt)

{
  code *pcVar1;
  bool bVar2;
  ValueType valueType;
  undefined4 *puVar3;
  RegOpnd *this_00;
  IntConstOpnd *src1Opnd;
  Instr *instr_00;
  Instr *instr;
  RegOpnd *dstOpnd;
  int constInt_local;
  RegSlot dstRegSlot_local;
  uint32 offset_local;
  OpCodeAsmJs newOpcode_local;
  IRBuilderAsmJs *this_local;
  
  if (newOpcode != Ld_IntConst) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                       ,0x8ee,"(newOpcode == Js::OpCodeAsmJs::Ld_IntConst)",
                       "newOpcode == Js::OpCodeAsmJs::Ld_IntConst");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  this_00 = BuildDstOpnd(this,dstRegSlot,TyInt32);
  valueType = ValueType::GetInt(false);
  IR::Opnd::SetValueType(&this_00->super_Opnd,valueType);
  src1Opnd = IR::IntConstOpnd::New((long)constInt,TyInt32,this->m_func,false);
  instr_00 = IR::Instr::New(Ld_I4,&this_00->super_Opnd,&src1Opnd->super_Opnd,this->m_func);
  bVar2 = StackSym::IsSingleDef(this_00->m_sym);
  if (bVar2) {
    StackSym::SetIsIntConst(this_00->m_sym,(long)constInt);
  }
  AddInstr(this,instr_00,offset);
  return;
}

Assistant:

void
IRBuilderAsmJs::BuildInt1Const1(Js::OpCodeAsmJs newOpcode, uint32 offset, Js::RegSlot dstRegSlot, int constInt)
{
    Assert(newOpcode == Js::OpCodeAsmJs::Ld_IntConst);

    IR::RegOpnd * dstOpnd = BuildDstOpnd(dstRegSlot, TyInt32);
    dstOpnd->SetValueType(ValueType::GetInt(false));

    IR::Instr * instr = IR::Instr::New(Js::OpCode::Ld_I4, dstOpnd, IR::IntConstOpnd::New(constInt, TyInt32, m_func), m_func);

    if (dstOpnd->m_sym->IsSingleDef())
    {
        dstOpnd->m_sym->SetIsIntConst(constInt);
    }

    AddInstr(instr, offset);
}